

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

void __thiscall Js::LdLenInfo::Merge(LdLenInfo *this,LdLenInfo *other)

{
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  bool bVar1;
  Bits bits;
  LdLenInfo *other_local;
  LdLenInfo *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  valueType.field_0 = (other->arrayType).field_0.field_0;
  merged = ValueType::Verify((ValueType)
                             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                              &(this->arrayType).field_0.field_0);
  local_1e.field_0 = valueType.field_0;
  local_20.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Verify(valueType.field_0);
  this_local._6_2_ = valueType.field_0;
  bVar1 = ValueType::operator==(&this->arrayType,(ValueType)valueType.field_0);
  if (bVar1) {
    local_a.field_0 =
         *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
          &(this->arrayType).field_0;
  }
  else {
    bits = ::operator|((this->arrayType).field_0.bits,valueType.bits);
    ValueType::ValueType((ValueType *)((long)&this_local + 4),bits);
    bVar1 = ValueType::OneOn((ValueType *)((long)&this_local + 4),Object);
    if (bVar1) {
      this_local._0_2_ = valueType.field_0;
      local_a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::MergeWithObject(&this->arrayType,valueType.field_0);
    }
    else {
      this_local._2_2_ = this_local._4_2_;
      local_a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::Verify(this_local._4_2_);
    }
  }
  (this->arrayType).field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_a;
  (this->field_1).bits = (this->field_1).bits | (other->field_1).bits;
  return;
}

Assistant:

void Merge(const LdLenInfo & other)
        {
            arrayType = arrayType.Merge(other.arrayType);
            bits |= other.bits;
        }